

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind6-error.c
# Opt level: O2

int run_test_tcp_bind6_error_addrnotavail(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  undefined8 uStack_130;
  sockaddr_in6 addr;
  uv_tcp_t server;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    return 1;
  }
  iVar1 = uv_ip6_addr("4:4:4:4:4:4:4:4",0x23a3,&addr);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,&server);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_bind(&server,&addr,0);
      if (iVar1 == -99) {
        uv_close(&server,close_cb);
        uVar2 = uv_default_loop();
        uv_run(uVar2,0);
        if (close_cb_called == 1) {
          loop = (uv_loop_t *)uv_default_loop();
          close_loop(loop);
          uVar2 = uv_default_loop();
          iVar1 = uv_loop_close(uVar2);
          if (iVar1 == 0) {
            return 0;
          }
          pcVar3 = "0 == uv_loop_close(uv_default_loop())";
          uStack_130 = 0x5f;
        }
        else {
          pcVar3 = "close_cb_called == 1";
          uStack_130 = 0x5d;
        }
      }
      else {
        pcVar3 = "r == UV_EADDRNOTAVAIL";
        uStack_130 = 0x57;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_130 = 0x55;
    }
  }
  else {
    pcVar3 = "0 == uv_ip6_addr(\"4:4:4:4:4:4:4:4\", TEST_PORT, &addr)";
    uStack_130 = 0x52;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
          ,uStack_130,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_bind6_error_addrnotavail) {
  struct sockaddr_in6 addr;
  uv_tcp_t server;
  int r;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip6_addr("4:4:4:4:4:4:4:4", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == UV_EADDRNOTAVAIL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}